

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Card *card)

{
  ostream *poVar1;
  string local_58;
  string local_38;
  
  suitName_abi_cxx11_(&local_38,card->m_suit);
  poVar1 = std::operator<<(os,local_38._M_dataplus._M_p);
  valueName_abi_cxx11_(&local_58,card->m_value);
  std::operator<<(poVar1,local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Card &card) {
    os << suitName(card.m_suit).c_str() << valueName(card.m_value).c_str();
    return os;
}